

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash_dictionary_handler.c
# Opt level: O0

ion_err_t oadict_scan(ion_oadict_cursor_t *cursor)

{
  ion_dictionary_parent_t *piVar1;
  ion_boolean_t iVar2;
  ion_dictionary_compare_t p_Var3;
  ion_boolean_t key_satisfies_predicate;
  ion_hash_bucket_t *item;
  int loc;
  ion_hashmap_t *hash_map;
  ion_oadict_cursor_t *cursor_local;
  
  piVar1 = ((cursor->super).dictionary)->instance;
  item._4_4_ = (cursor->current + 1) % (int)piVar1[1].key_type;
  while( true ) {
    if (item._4_4_ == cursor->first) {
      return '\x01';
    }
    p_Var3 = piVar1[1].compare +
             ((piVar1->record).key_size + (piVar1->record).value_size + 1) * item._4_4_;
    if (((*p_Var3 != (_func_char_ion_key_t_ion_key_t_ion_key_size_t)0xff) &&
        (*p_Var3 != (_func_char_ion_key_t_ion_key_t_ion_key_size_t)0xfe)) &&
       (iVar2 = test_predicate(&cursor->super,p_Var3 + 1), iVar2 == '\x01')) break;
    item._4_4_ = item._4_4_ + 1;
    if ((int)piVar1[1].key_type <= item._4_4_) {
      item._4_4_ = 0;
    }
  }
  cursor->current = item._4_4_;
  return '\x04';
}

Assistant:

ion_err_t
oadict_scan(
	ion_oadict_cursor_t *cursor	/* don't need to pass in the cursor */
) {
	/* need to scan hashmap fully looking for values that satisfy - need to think about */
	ion_hashmap_t *hash_map = (ion_hashmap_t *) (cursor->super.dictionary->instance);

	int loc					= (cursor->current + 1) % hash_map->map_size;

	/* this is the current position of the cursor */
	/* and start scanning 1 ahead */

	/* start at the current position, scan forward */
	while (loc != cursor->first) {
		/* check to see if current item is a match based on key */
		/* locate first item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* if empty, just skip to next cell */
			loc++;
		}
		else {
			/* check to see if the current key value satisfies the predicate */

			ion_boolean_t key_satisfies_predicate = test_predicate(&(cursor->super), item->data);	/* assumes that the key is first */

			if (key_satisfies_predicate == boolean_true) {
				cursor->current = loc;	/* this is the next index for value */
				return cs_cursor_active;
			}

			/* If valid bucket is not found, advance current position. */
			loc++;
		}

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
		}
	}

	/* if you end up here, you've wrapped the entire data structure and not found a value */
	return cs_end_of_results;
}